

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

void ImageRotateCW(Image *image)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int i;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  void *pvVar14;
  long lVar15;
  long lVar16;
  int x;
  ulong uVar17;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    if (0xd < image->format) {
      TraceLog(4,"Image manipulation not supported for compressed formats");
      return;
    }
    uVar4 = GetPixelDataSize(1,1,image->format);
    uVar3 = image->width;
    uVar12 = image->height;
    lVar16 = (long)(int)uVar12;
    pvVar5 = malloc((long)(int)(uVar3 * uVar12 * uVar4));
    lVar6 = 0;
    uVar7 = 0;
    if (0 < (int)uVar4) {
      uVar7 = (ulong)uVar4;
    }
    lVar8 = (long)(int)uVar4;
    uVar10 = 0;
    if (0 < (int)uVar3) {
      uVar10 = (ulong)uVar3;
    }
    uVar11 = 0;
    if (0 < (int)uVar12) {
      uVar11 = (ulong)uVar12;
    }
    for (uVar13 = 0; uVar12 = uVar12 - 1, uVar13 != uVar11; uVar13 = uVar13 + 1) {
      pvVar14 = (void *)((int)uVar12 * lVar8 + (long)pvVar5);
      lVar15 = lVar6;
      for (uVar17 = 0; uVar17 != uVar10; uVar17 = uVar17 + 1) {
        for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
          *(undefined1 *)((long)pvVar14 + uVar9) =
               *(undefined1 *)((long)image->data + uVar9 + lVar15);
        }
        pvVar14 = (void *)((long)pvVar14 + lVar16 * lVar8);
        lVar15 = lVar15 + lVar8;
      }
      lVar6 = lVar6 + (int)uVar3 * lVar8;
    }
    free(image->data);
    image->data = pvVar5;
    uVar1 = image->width;
    uVar2 = image->height;
    image->width = uVar2;
    image->height = uVar1;
  }
  return;
}

Assistant:

void ImageRotateCW(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else
    {
        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);
        unsigned char *rotatedData = (unsigned char *)RL_MALLOC(image->width*image->height*bytesPerPixel);

        for (int y = 0; y < image->height; y++)
        {
            for (int x = 0; x < image->width; x++)
            {
                //memcpy(rotatedData + (x*image->height + (image->height - y - 1))*bytesPerPixel, ((unsigned char *)image->data) + (y*image->width + x)*bytesPerPixel, bytesPerPixel);
                for (int i = 0; i < bytesPerPixel; i++) rotatedData[(x*image->height + (image->height - y - 1))*bytesPerPixel + i] = ((unsigned char *)image->data)[(y*image->width + x)*bytesPerPixel + i];
            }
        }

        RL_FREE(image->data);
        image->data = rotatedData;
        int width = image->width;
        int height = image-> height;

        image->width = height;
        image->height = width;
    }
}